

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void do_int_pro_motion_estimation
               (AV1_COMP *cpi,MACROBLOCK *x,uint *y_sad,int mi_row,int mi_col,int source_sad_nonrd)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  uint thresh_sad;
  uint y_sad_zero;
  int me_search_size_row;
  int me_search_size_col;
  int increase_col_sw;
  int is_screen;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MV *in_stack_000000d8;
  int in_stack_000000e4;
  int in_stack_000000e8;
  BLOCK_SIZE in_stack_000000ef;
  MACROBLOCK *in_stack_000000f0;
  AV1_COMP *in_stack_000000f8;
  uint *in_stack_00000110;
  int in_stack_00000118;
  int in_stack_00000120;
  uint local_54;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  iVar3 = *(int *)(in_RDI + 0x4269c);
  uVar2 = av1_int_pro_motion_estimation
                    (in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,in_stack_000000e8,
                     in_stack_000000e4,in_stack_000000d8,in_stack_00000110,in_stack_00000118,
                     in_stack_00000120);
  *in_RDX = uVar2;
  if (iVar3 == 1) {
    uVar2 = 20000;
    if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x1c) == '\x0f') {
      uVar2 = 50000;
    }
    if ((*in_RDX < local_54 >> 1) && (*in_RDX < uVar2)) {
      *(undefined4 *)(in_RSI + 0x25648) = 1;
      *(undefined4 *)(in_RSI + 0x25658) = *(undefined4 *)(lVar1 + 8);
      if (*(int *)(in_RDI + 0x9d334) == 0) {
        iVar3 = (int)*(short *)(lVar1 + 10);
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if (0x10 < iVar3) {
          iVar3 = (int)*(short *)(lVar1 + 8);
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 == 0) {
            *(undefined4 *)(in_RSI + 0x25650) = 1;
            return;
          }
        }
        iVar3 = (int)*(short *)(lVar1 + 8);
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if (0x10 < iVar3) {
          iVar3 = (int)*(short *)(lVar1 + 10);
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 == 0) {
            *(undefined4 *)(in_RSI + 0x25654) = 1;
          }
        }
      }
    }
    else {
      *(undefined4 *)(in_RSI + 0x25648) = 0;
      *in_RDX = local_54;
      *(undefined4 *)(lVar1 + 8) = 0;
    }
  }
  return;
}

Assistant:

static void do_int_pro_motion_estimation(AV1_COMP *cpi, MACROBLOCK *x,
                                         unsigned int *y_sad, int mi_row,
                                         int mi_col, int source_sad_nonrd) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mi = xd->mi[0];
  const int is_screen = cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  const int increase_col_sw = source_sad_nonrd > kMedSad &&
                              !cpi->rc.high_motion_content_screen_rtc &&
                              (cpi->svc.temporal_layer_id == 0 ||
                               cpi->rc.num_col_blscroll_last_tl0 > 2);
  int me_search_size_col = is_screen
                               ? increase_col_sw ? 512 : 96
                               : block_size_wide[cm->seq_params->sb_size] >> 1;
  // For screen use larger search size row motion to capture
  // vertical scroll, which can be larger motion.
  int me_search_size_row = is_screen
                               ? source_sad_nonrd > kMedSad ? 512 : 192
                               : block_size_high[cm->seq_params->sb_size] >> 1;
  unsigned int y_sad_zero;
  *y_sad = av1_int_pro_motion_estimation(
      cpi, x, cm->seq_params->sb_size, mi_row, mi_col, &kZeroMv, &y_sad_zero,
      me_search_size_col, me_search_size_row);
  // The logic below selects whether the motion estimated in the
  // int_pro_motion() will be used in nonrd_pickmode. Only do this
  // for screen for now.
  if (is_screen) {
    unsigned int thresh_sad =
        (cm->seq_params->sb_size == BLOCK_128X128) ? 50000 : 20000;
    if (*y_sad < (y_sad_zero >> 1) && *y_sad < thresh_sad) {
      x->sb_me_partition = 1;
      x->sb_me_mv.as_int = mi->mv[0].as_int;
      if (cpi->svc.temporal_layer_id == 0) {
        if (abs(mi->mv[0].as_mv.col) > 16 && abs(mi->mv[0].as_mv.row) == 0)
          x->sb_col_scroll = 1;
        else if (abs(mi->mv[0].as_mv.row) > 16 && abs(mi->mv[0].as_mv.col) == 0)
          x->sb_row_scroll = 1;
      }
    } else {
      x->sb_me_partition = 0;
      // Fall back to using zero motion.
      *y_sad = y_sad_zero;
      mi->mv[0].as_int = 0;
    }
  }
}